

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall
pstore::broker::command_processor::gc(command_processor *this,fifo_path *param_1,broker_command *c)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  string local_1d0;
  value_type local_1b0;
  ostringstream os;
  
  start_vacuum(&c->path);
  this->commits_ = this->commits_ + 1;
  bVar1 = brokerface::channel<pstore::descriptor_condition_variable>::have_listeners
                    ((channel<pstore::descriptor_condition_variable> *)commits_channel);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
    poVar2 = std::operator<<((ostream *)&os,"{ \"commits\": ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2," }");
    std::__cxx11::stringbuf::str();
    bVar1 = json::is_valid(&local_1d0);
    if (!bVar1) {
      assert_failed("json::is_valid (str)",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                    ,0x7a);
    }
    std::__cxx11::string::string((string *)&local_1b0,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
    std::mutex::lock((mutex *)commits_channel);
    plVar3 = (long *)(commits_channel + 0x40);
    while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)plVar3[1],&local_1b0);
    }
    descriptor_condition_variable::notify_all
              ((descriptor_condition_variable *)commits_channel._40_8_);
    pthread_mutex_unlock((pthread_mutex_t *)commits_channel);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  return;
}

Assistant:

void command_processor::gc (brokerface::fifo_path const &, broker_command const & c) {
            start_vacuum (c.path);

            ++commits_;
            commits_channel.publish ([this] () {
                std::ostringstream os;
                os << "{ \"commits\": " << commits_ << " }";
                std::string const & str = os.str ();
                PSTORE_ASSERT (json::is_valid (str));
                return str;
            });
        }